

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::StructBuilderArgs
          (PythonGenerator *this,StructDef *struct_def,string *nameprefix,string *namesuffix,
          bool has_field_name,string *fieldname_suffix,string *code_ptr)

{
  IdlNamer *pIVar1;
  FieldDef *pFVar2;
  StructDef *struct_def_00;
  BaseType BVar3;
  pointer ppFVar4;
  string subprefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  PythonGenerator *local_e0;
  StructDef *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pIVar1 = &this->namer_;
  local_e0 = this;
  local_d8 = struct_def;
  for (ppFVar4 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar4 !=
      (local_d8->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar4 = ppFVar4 + 1) {
    pFVar2 = *ppFVar4;
    BVar3 = (pFVar2->value).type.base_type;
    if (BVar3 == BASE_TYPE_ARRAY) {
      BVar3 = (pFVar2->value).type.element;
    }
    if ((BVar3 == BASE_TYPE_STRUCT) && (((pFVar2->value).type.struct_def)->fixed == true)) {
      std::__cxx11::string::string((string *)&local_100,(string *)nameprefix);
      if (has_field_name) {
        (*(pIVar1->super_Namer)._vptr_Namer[0x12])(&local_d0,pIVar1,pFVar2);
        std::operator+(&local_b0,&local_d0,fieldname_suffix);
        std::__cxx11::string::append((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      struct_def_00 = (pFVar2->value).type.struct_def;
      std::__cxx11::string::string((string *)&local_50,(string *)&local_100);
      std::__cxx11::string::string((string *)&local_70,(string *)namesuffix);
      std::__cxx11::string::string((string *)&local_90,(string *)fieldname_suffix);
      StructBuilderArgs(local_e0,struct_def_00,&local_50,&local_70,has_field_name,&local_90,code_ptr
                       );
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_100);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,", ",(allocator<char> *)&local_d0);
      std::operator+(&local_100,&local_b0,nameprefix);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_b0);
      if (has_field_name) {
        (*(pIVar1->super_Namer)._vptr_Namer[0x12])(&local_100,pIVar1,pFVar2);
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_100);
      }
      std::__cxx11::string::append((string *)code_ptr);
    }
  }
  return;
}

Assistant:

void StructBuilderArgs(const StructDef &struct_def,
                         const std::string nameprefix,
                         const std::string namesuffix, bool has_field_name,
                         const std::string fieldname_suffix,
                         std::string *code_ptr) const {
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      const auto &type =
          IsArray(field_type) ? field_type.VectorType() : field_type;
      if (IsStruct(type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        auto subprefix = nameprefix;
        if (has_field_name) {
          subprefix += namer_.Field(field) + fieldname_suffix;
        }
        StructBuilderArgs(*field.value.type.struct_def, subprefix, namesuffix,
                          has_field_name, fieldname_suffix, code_ptr);
      } else {
        auto &code = *code_ptr;
        code += std::string(", ") + nameprefix;
        if (has_field_name) { code += namer_.Field(field); }
        code += namesuffix;
      }
    }
  }